

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::ShellCommand::processDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context)

{
  Child *pCVar1;
  StringRef depsPath;
  StringRef depsPath_00;
  bool bVar2;
  FileSystem *pFVar3;
  BuildSystemDelegate *pBVar4;
  long *plVar5;
  Child input;
  string *Str;
  ulong uVar6;
  long lVar7;
  BuildSystem *this_00;
  bool bVar8;
  SmallString<4096U> absPath;
  char *pcVar9;
  size_t sVar10;
  Child local_10f0;
  undefined8 local_10e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10e0;
  BuildSystem *local_10d0;
  ShellCommand *local_10c8;
  long local_10c0;
  Child local_10b8 [3];
  char *local_10a0;
  size_t sStack_1098;
  pointer local_1090;
  size_type sStack_1088;
  char *local_1080;
  size_t sStack_1078;
  Twine local_1070;
  Twine local_1058;
  Child local_1040;
  ulong local_1038;
  Child local_1030;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  
  if (this->depsStyle == Unused) {
    pBVar4 = BuildSystem::getDelegate(system);
    (*pBVar4->_vptr_BuildSystemDelegate[0xb])
              (pBVar4,this,"missing required \'deps-style\' specifier",0x27);
    bVar8 = false;
  }
  else {
    uVar6 = (ulong)(this->depsPaths).
                   super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   .
                   super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   .super_SmallVectorBase.Size;
    bVar8 = uVar6 == 0;
    if (!bVar8) {
      Str = (string *)
            (this->depsPaths).
            super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            .super_SmallVectorBase.BeginX;
      lVar7 = uVar6 << 5;
      local_10d0 = system;
      local_10c8 = this;
      do {
        this_00 = local_10d0;
        llvm::Twine::Twine((Twine *)&local_1040,Str);
        bVar2 = llvm::sys::path::is_absolute((Twine *)&local_1040,native);
        if (bVar2) {
          pFVar3 = BuildSystem::getFileSystem(this_00);
          (*pFVar3->_vptr_FileSystem[4])(&local_1040,pFVar3,Str);
          input = local_1040;
        }
        else {
          pcVar9 = (this->workingDirectory)._M_dataplus._M_p;
          local_1040.twine = (Twine *)&local_1030;
          local_1038 = 0x100000000000;
          local_10c0 = lVar7;
          llvm::SmallVectorImpl<char>::append<char_const*,void>
                    ((SmallVectorImpl<char> *)&local_1040,pcVar9,
                     pcVar9 + (this->workingDirectory)._M_string_length);
          llvm::Twine::Twine((Twine *)&local_10f0,Str);
          llvm::Twine::Twine((Twine *)local_10b8,"");
          llvm::Twine::Twine(&local_1070,"");
          context = (QueueJobContext *)&local_1058;
          llvm::Twine::Twine((Twine *)context,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&local_1040,(Twine *)&local_10f0,(Twine *)local_10b8,
                     &local_1070,(Twine *)context);
          llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)&local_1040);
          pFVar3 = BuildSystem::getFileSystem(this_00);
          local_10f0.twine = (Twine *)&local_10e0;
          if (&(local_1040.twine)->LHS == (Child *)0x0) {
            local_10e8 = 0;
            local_10e0._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_10f0,local_1040.twine,
                       (long)&(local_1040.twine)->LHS + (local_1038 & 0xffffffff));
          }
          (*pFVar3->_vptr_FileSystem[4])(local_10b8,pFVar3,&local_10f0);
          input = local_10b8[0];
          lVar7 = local_10c0;
          this = local_10c8;
          local_10b8[0].twine = (Twine *)0x0;
          if (local_10f0.twine != (Twine *)&local_10e0) {
            operator_delete(local_10f0.twine,
                            CONCAT71(local_10e0._M_allocated_capacity._1_7_,
                                     local_10e0._M_local_buf[0]) + 1);
          }
          this_00 = local_10d0;
          if (&(local_1040.twine)->LHS != &local_1030) {
            free(local_1040.twine);
          }
        }
        if (&(input.twine)->LHS == (Child *)0x0) {
          pBVar4 = BuildSystem::getDelegate(this_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_10f0,"unable to open dependencies file (",Str);
          plVar5 = (long *)std::__cxx11::string::append(&local_10f0.character);
          pCVar1 = (Child *)(plVar5 + 2);
          if ((Child *)*plVar5 == pCVar1) {
            local_1030.twine = pCVar1->twine;
            uStack_1028 = (undefined4)plVar5[3];
            uStack_1024 = *(undefined4 *)((long)plVar5 + 0x1c);
            local_1040.twine = (Twine *)&local_1030;
          }
          else {
            local_1030.twine = pCVar1->twine;
            local_1040.decUL = ((unsigned_long *)*plVar5).decUL;
          }
          local_1038 = plVar5[1];
          *plVar5 = (long)pCVar1;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          (*pBVar4->_vptr_BuildSystemDelegate[0xb])(pBVar4,this,local_1040.twine,local_1038);
          if (local_1040.twine != (Twine *)&local_1030) {
            operator_delete(local_1040.twine,(ulong)((long)&(local_1030.twine)->LHS + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10f0.twine != &local_10e0) {
            operator_delete(local_10f0.twine,
                            CONCAT71(local_10e0._M_allocated_capacity._1_7_,
                                     local_10e0._M_local_buf[0]) + 1);
          }
          bVar2 = false;
        }
        else {
          switch(this->depsStyle) {
          case Unused:
            __assert_fail("0 && \"unreachable\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp"
                          ,0x68,
                          "bool llbuild::buildsystem::ShellCommand::processDiscoveredDependencies(BuildSystem &, core::TaskInterface, QueueJobContext *)"
                         );
          case Makefile:
            pcVar9 = (Str->_M_dataplus)._M_p;
            sVar10 = Str->_M_string_length;
            bVar2 = false;
            local_1080 = pcVar9;
            sStack_1078 = sVar10;
            break;
          case DependencyInfo:
            local_1090 = (Str->_M_dataplus)._M_p;
            sStack_1088 = Str->_M_string_length;
            depsPath_00.Data = (Str->_M_dataplus)._M_p;
            depsPath_00.Length = Str->_M_string_length;
            bVar2 = processDependencyInfoDiscoveredDependencies
                              (this,this_00,ti,context,depsPath_00,(MemoryBuffer *)input.twine);
            goto LAB_00179e91;
          case MakefileIgnoringSubsequentOutputs:
            pcVar9 = (Str->_M_dataplus)._M_p;
            sVar10 = Str->_M_string_length;
            bVar2 = true;
            local_10a0 = pcVar9;
            sStack_1098 = sVar10;
            break;
          default:
            llvm::report_fatal_error("unknown dependencies style",true);
          }
          depsPath.Length = sVar10;
          depsPath.Data = pcVar9;
          bVar2 = processMakefileDiscoveredDependencies
                            (this,this_00,ti,context,depsPath,(MemoryBuffer *)input.twine,bVar2);
        }
LAB_00179e91:
        if (&(input.twine)->LHS != (Child *)0x0) {
          (*(code *)((Twine *)*input.decUL)->RHS)(input.twine);
        }
        if (bVar2 == false) {
          return bVar8;
        }
        Str = Str + 1;
        lVar7 = lVar7 + -0x20;
        bVar8 = lVar7 == 0;
      } while (!bVar8);
    }
  }
  return bVar8;
}

Assistant:

bool ShellCommand::processDiscoveredDependencies(BuildSystem& system,
                                                 core::TaskInterface ti,
                                                 QueueJobContext* context) {
  // It is an error if the dependencies style is not specified.
  //
  // FIXME: Diagnose this sooner.
  if (depsStyle == DepsStyle::Unused) {
    system.getDelegate().commandHadError(
        this, "missing required 'deps-style' specifier");
    return false;
  }

  for (const auto& depsPath: depsPaths) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(
          this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }

    switch (depsStyle) {
    case DepsStyle::Unused:
      assert(0 && "unreachable");
      break;

    case DepsStyle::Makefile:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), false))
        return false;
      continue;

    case DepsStyle::DependencyInfo:
      if (!processDependencyInfoDiscoveredDependencies(
              system, ti, context, depsPath, input.get()))
        return false;
      continue;

    case DepsStyle::MakefileIgnoringSubsequentOutputs:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), true))
        return false;
      continue;
    }
      
    llvm::report_fatal_error("unknown dependencies style");
  }

  return true;
}